

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O1

QCborValue *
QCborContainerPrivate::findCborMapKey<long_long>
          (QCborValue *__return_storage_ptr__,QCborValue *self,longlong key)

{
  QCborContainerPrivate *this;
  ulong uVar1;
  ulong uVar2;
  Type *pTVar3;
  
  if ((self->t == Map) && (this = self->container, this != (QCborContainerPrivate *)0x0)) {
    uVar1 = (this->elements).d.size;
    if (uVar1 == 0) {
      uVar2 = 1;
    }
    else {
      pTVar3 = &((this->elements).d.ptr)->type;
      uVar2 = 0;
      do {
        if ((*pTVar3 == Integer) && ((((Element *)(pTVar3 + -2))->field_0).value == key)) break;
        uVar2 = uVar2 + 2;
        pTVar3 = pTVar3 + 8;
      } while (uVar2 < uVar1);
      uVar2 = uVar2 | 1;
    }
    if ((long)uVar2 < (this->elements).d.size) {
      valueAt(__return_storage_ptr__,this,uVar2);
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
  __return_storage_ptr__->t = Undefined;
  return __return_storage_ptr__;
}

Assistant:

static QCborValue findCborMapKey(const QCborValue &self, KeyType key)
    {
        if (self.isMap() && self.container) {
            qsizetype idx = self.container->findCborMapKey(key).i;
            if (idx < self.container->elements.size())
                return self.container->valueAt(idx);
        }
        return QCborValue();
    }